

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMap.c
# Opt level: O0

If_Obj_t * Lpk_MapPrimeInternal(If_Man_t *pIfMan,Kit_Graph_t *pGraph)

{
  int iVar1;
  uint uVar2;
  Kit_Node_t *pKVar3;
  If_Obj_t *pIVar4;
  If_Obj_t *pIVar5;
  If_Obj_t *pIVar6;
  int local_3c;
  int i;
  If_Obj_t *pAnd1;
  If_Obj_t *pAnd0;
  Kit_Node_t *pNode;
  Kit_Graph_t *pGraph_local;
  If_Man_t *pIfMan_local;
  
  pAnd0 = (If_Obj_t *)0x0;
  iVar1 = Kit_GraphIsConst(pGraph);
  if (iVar1 == 0) {
    iVar1 = Kit_GraphIsVar(pGraph);
    if (iVar1 == 0) {
      for (local_3c = pGraph->nLeaves; local_3c < pGraph->nSize; local_3c = local_3c + 1) {
        pAnd0 = (If_Obj_t *)Kit_GraphNode(pGraph,local_3c);
        pKVar3 = Kit_GraphNode(pGraph,*(uint *)pAnd0 >> 1 & 0x3fffffff);
        pIVar5 = (If_Obj_t *)(pKVar3->field_2).pFunc;
        pKVar3 = Kit_GraphNode(pGraph,(uint)*(Kit_Edge_t *)&pAnd0->Id >> 1 & 0x3fffffff);
        pIVar6 = (If_Obj_t *)(pKVar3->field_2).pFunc;
        pIVar4 = If_Regular(pIVar5);
        uVar2 = If_IsComplement(pIVar5);
        pIVar5 = If_NotCond(pIVar4,uVar2 ^ *(uint *)pAnd0 & 1);
        pIVar4 = If_Regular(pIVar6);
        uVar2 = If_IsComplement(pIVar6);
        pIVar6 = If_NotCond(pIVar4,uVar2 ^ (uint)*(Kit_Edge_t *)&pAnd0->Id & 1);
        pIVar5 = If_ManCreateAnd(pIfMan,pIVar5,pIVar6);
        ((anon_union_8_2_00c7e208_for_Kit_Node_t__2 *)&pAnd0->IdPio)->pFunc = pIVar5;
      }
      pIfMan_local = *(If_Man_t **)&pAnd0->IdPio;
    }
    else {
      pKVar3 = Kit_GraphVar(pGraph);
      pIfMan_local = (If_Man_t *)(pKVar3->field_2).pFunc;
    }
  }
  else {
    pIfMan_local = (If_Man_t *)If_ManConst1(pIfMan);
  }
  return (If_Obj_t *)pIfMan_local;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Transforms the decomposition graph into the AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
If_Obj_t * Lpk_MapPrimeInternal( If_Man_t * pIfMan, Kit_Graph_t * pGraph )
{
    Kit_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    If_Obj_t * pAnd0, * pAnd1;
    int i;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return If_ManConst1(pIfMan);
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return (If_Obj_t *)Kit_GraphVar(pGraph)->pFunc;
    // build the AIG nodes corresponding to the AND gates of the graph
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = (If_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc; 
        pAnd1 = (If_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc; 
        pNode->pFunc = If_ManCreateAnd( pIfMan, 
            If_NotCond( If_Regular(pAnd0), If_IsComplement(pAnd0) ^ pNode->eEdge0.fCompl ), 
            If_NotCond( If_Regular(pAnd1), If_IsComplement(pAnd1) ^ pNode->eEdge1.fCompl ) );
    }
    return (If_Obj_t *)pNode->pFunc;
}